

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobject.cpp
# Opt level: O0

size_t __thiscall DObject::PropagateMark(DObject *this)

{
  PClass *this_00;
  size_t *local_28;
  size_t *offsets;
  PClass *info;
  DObject *this_local;
  
  this_00 = GetClass(this);
  if ((PClass::bShutdown & 1U) == 0) {
    local_28 = this_00->FlatPointers;
    if (local_28 == (size_t *)0x0) {
      PClass::BuildFlatPointers(this_00);
      local_28 = this_00->FlatPointers;
    }
    for (; *local_28 != 0xffffffffffffffff; local_28 = local_28 + 1) {
      GC::Mark((DObject **)((long)&this->_vptr_DObject + *local_28));
    }
    this_local = (DObject *)
                 (ulong)*(uint *)((long)&(this_00->super_PNativeStruct).super_PStruct.
                                         super_PNamedType.super_PCompoundType.super_PType.
                                         super_PTypeBase.super_DObject + 0x24);
  }
  else {
    this_local = (DObject *)0x0;
  }
  return (size_t)this_local;
}

Assistant:

size_t DObject::PropagateMark()
{
	const PClass *info = GetClass();
	if (!PClass::bShutdown)
	{
		const size_t *offsets = info->FlatPointers;
		if (offsets == NULL)
		{
			const_cast<PClass *>(info)->BuildFlatPointers();
			offsets = info->FlatPointers;
		}
		while (*offsets != ~(size_t)0)
		{
			GC::Mark((DObject **)((BYTE *)this + *offsets));
			offsets++;
		}
		return info->Size;
	}
	return 0;
}